

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O3

void __thiscall btSparseSdf<3>::Reset(btSparseSdf<3> *this)

{
  Cell **ppCVar1;
  Cell *pCVar2;
  Cell *pCVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)(this->cells).m_size;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      ppCVar1 = (this->cells).m_data;
      pCVar2 = ppCVar1[lVar5];
      ppCVar1[lVar5] = (Cell *)0x0;
      while (pCVar2 != (Cell *)0x0) {
        pCVar3 = pCVar2->next;
        operator_delete(pCVar2);
        pCVar2 = pCVar3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
  }
  this->voxelsz = 0.25;
  this->puid = 0;
  this->ncells = 0;
  this->nprobes = 1;
  this->nqueries = 1;
  return;
}

Assistant:

void					Reset()
	{
		for(int i=0,ni=cells.size();i<ni;++i)
		{
			Cell*	pc=cells[i];
			cells[i]=0;
			while(pc)
			{
				Cell*	pn=pc->next;
				delete pc;
				pc=pn;
			}
		}
		voxelsz		=0.25;
		puid		=0;
		ncells		=0;
		nprobes		=1;
		nqueries	=1;
	}